

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeTextureApiTests.cpp
# Opt level: O1

void deqp::gles31::Functional::NegativeTestShared::texsubimage3d_neg_level(NegativeTestContext *ctx)

{
  bool bVar1;
  ContextType ctxType;
  deUint32 textures [3];
  string local_50;
  
  glu::CallLogWrapper::glGenTextures(&ctx->super_CallLogWrapper,3,textures);
  glu::CallLogWrapper::glBindTexture(&ctx->super_CallLogWrapper,0x806f,textures[0]);
  glu::CallLogWrapper::glTexImage3D
            (&ctx->super_CallLogWrapper,0x806f,0,0x1908,4,4,4,0,0x1908,0x1401,(void *)0x0);
  glu::CallLogWrapper::glBindTexture(&ctx->super_CallLogWrapper,0x8c1a,textures[1]);
  glu::CallLogWrapper::glTexImage3D
            (&ctx->super_CallLogWrapper,0x8c1a,0,0x1908,4,4,4,0,0x1908,0x1401,(void *)0x0);
  NegativeTestContext::expectError(ctx,0);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"GL_INVALID_VALUE is generated if level is less than 0.","");
  NegativeTestContext::beginSection(ctx,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glTexSubImage3D
            (&ctx->super_CallLogWrapper,0x806f,-1,0,0,0,0,0,0,0x1908,0x1401,(void *)0x0);
  NegativeTestContext::expectError(ctx,0x501);
  glu::CallLogWrapper::glTexSubImage3D
            (&ctx->super_CallLogWrapper,0x8c1a,-1,0,0,0,0,0,0,0x1908,0x1401,(void *)0x0);
  NegativeTestContext::expectError(ctx,0x501);
  ctxType.super_ApiType.m_bits = (ApiType)(*ctx->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x23);
  if (!bVar1) {
    bVar1 = glu::ContextInfo::isExtensionSupported(ctx->m_ctxInfo,"GL_OES_texture_cube_map_array");
    if (!bVar1) goto LAB_0059d1ca;
  }
  glu::CallLogWrapper::glBindTexture(&ctx->super_CallLogWrapper,0x9009,textures[2]);
  glu::CallLogWrapper::glTexImage3D
            (&ctx->super_CallLogWrapper,0x9009,0,0x1908,4,4,6,0,0x1908,0x1401,(void *)0x0);
  NegativeTestContext::expectError(ctx,0);
  glu::CallLogWrapper::glTexSubImage3D
            (&ctx->super_CallLogWrapper,0x9009,-1,0,0,0,0,0,0,0x1908,0x1401,(void *)0x0);
  NegativeTestContext::expectError(ctx,0x501);
LAB_0059d1ca:
  NegativeTestContext::endSection(ctx);
  glu::CallLogWrapper::glDeleteTextures(&ctx->super_CallLogWrapper,3,textures);
  return;
}

Assistant:

void texsubimage3d_neg_level (NegativeTestContext& ctx)
{
	deUint32			textures[3];
	ctx.glGenTextures		(3, &textures[0]);
	ctx.glBindTexture		(GL_TEXTURE_3D, textures[0]);
	ctx.glTexImage3D		(GL_TEXTURE_3D, 0, GL_RGBA, 4, 4, 4, 0, GL_RGBA, GL_UNSIGNED_BYTE, 0);
	ctx.glBindTexture		(GL_TEXTURE_2D_ARRAY, textures[1]);
	ctx.glTexImage3D		(GL_TEXTURE_2D_ARRAY, 0, GL_RGBA, 4, 4, 4, 0, GL_RGBA, GL_UNSIGNED_BYTE, 0);
	ctx.expectError			(GL_NO_ERROR);

	ctx.beginSection("GL_INVALID_VALUE is generated if level is less than 0.");
	ctx.glTexSubImage3D(GL_TEXTURE_3D, -1, 0, 0, 0, 0, 0, 0, GL_RGBA, GL_UNSIGNED_BYTE, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glTexSubImage3D(GL_TEXTURE_2D_ARRAY, -1, 0, 0, 0, 0, 0, 0, GL_RGBA, GL_UNSIGNED_BYTE, 0);
	ctx.expectError(GL_INVALID_VALUE);

	if (contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)) || ctx.getContextInfo().isExtensionSupported("GL_OES_texture_cube_map_array"))
	{
		ctx.glBindTexture		(GL_TEXTURE_CUBE_MAP_ARRAY, textures[2]);
		ctx.glTexImage3D		(GL_TEXTURE_CUBE_MAP_ARRAY, 0, GL_RGBA, 4, 4, 6, 0, GL_RGBA, GL_UNSIGNED_BYTE, 0);
		ctx.expectError			(GL_NO_ERROR);

		ctx.glTexSubImage3D(GL_TEXTURE_CUBE_MAP_ARRAY, -1, 0, 0, 0, 0, 0, 0, GL_RGBA, GL_UNSIGNED_BYTE, 0);
		ctx.expectError(GL_INVALID_VALUE);
	}

	ctx.endSection();

	ctx.glDeleteTextures	(3, &textures[0]);
}